

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_StoPrintOne(Nf_Man_t *p,int Count,int t,int i,int GateId,Nf_Cfg_t Mat)

{
  int nVarsInit;
  Mio_Cell2_t *pMVar1;
  word *t_00;
  int iFanin;
  int fComplF;
  int nSuppSize;
  int k;
  word *pTruth;
  Mio_Cell2_t *pC;
  int GateId_local;
  int i_local;
  int t_local;
  int Count_local;
  Nf_Man_t *p_local;
  Nf_Cfg_t Mat_local;
  
  pMVar1 = p->pCells + GateId;
  t_00 = Vec_MemReadEntry(p->vTtMem,t);
  nVarsInit = Abc_TtSupportSize(t_00,6);
  printf("%6d : ",(ulong)(uint)Count);
  printf("%6d : ",(ulong)(uint)t);
  printf("%6d : ",(ulong)(uint)i);
  printf("Gate %16s  ",pMVar1->pName);
  printf("Area =%8.2f  ",(double)pMVar1->AreaF);
  printf("In = %d   ",(ulong)(*(uint *)&pMVar1->field_0x10 >> 0x1c));
  if (((uint)Mat & 1) == 0) {
    printf("       ");
  }
  else {
    printf(" compl ");
  }
  for (fComplF = 0; fComplF < (int)(*(uint *)&pMVar1->field_0x10 >> 0x1c); fComplF = fComplF + 1) {
    printf("%c",(ulong)(((int)((uint)Mat >> 8) >> ((byte)fComplF * '\x03' & 0x1f) & 7U) + 0x61 +
                       ((int)((uint)Mat >> 1 & 0x7f) >> ((byte)fComplF & 0x1f) & 1U) * -0x20));
  }
  printf("  ");
  Dau_DsdPrintFromTruth(t_00,nVarsInit);
  return;
}

Assistant:

void Nf_StoPrintOne( Nf_Man_t * p, int Count, int t, int i, int GateId, Nf_Cfg_t Mat )
{
    Mio_Cell2_t * pC = p->pCells + GateId;
    word * pTruth = Vec_MemReadEntry(p->vTtMem, t);
    int k, nSuppSize = Abc_TtSupportSize(pTruth, 6);
    printf( "%6d : ", Count );
    printf( "%6d : ", t );
    printf( "%6d : ", i );
    printf( "Gate %16s  ",   pC->pName );
    printf( "Area =%8.2f  ", pC->AreaF );
    printf( "In = %d   ",    pC->nFanins );
    if ( Mat.fCompl )
        printf( " compl " );
    else
        printf( "       " );
    for ( k = 0; k < (int)pC->nFanins; k++ )
    {
        int fComplF = (Mat.Phase >> k) & 1;
        int iFanin  = (Mat.Perm >> (3*k)) & 7;
        printf( "%c", 'a' + iFanin - fComplF * ('a' - 'A') );
    }
    printf( "  " );
    Dau_DsdPrintFromTruth( pTruth, nSuppSize );
}